

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

int hd_read_byte(hd_context *ctx,hd_stream *stm)

{
  byte *pbVar1;
  hd_error_stack_slot *phVar2;
  int iVar3;
  uint local_24;
  int c;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  local_24 = 0xffffffff;
  if (stm->rp == stm->wp) {
    iVar3 = hd_push_try(ctx);
    if ((iVar3 != 0) && (iVar3 = __sigsetjmp(ctx->error->top->buffer,0), iVar3 == 0)) {
      local_24 = (*stm->next)(ctx,stm,1);
    }
    phVar2 = ctx->error->top;
    ctx->error->top = phVar2 + -1;
    if (1 < phVar2->code) {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"read error; treating as end of file");
      stm->error = 1;
      local_24 = 0xffffffff;
    }
    if (local_24 == 0xffffffff) {
      stm->eof = 1;
    }
    ctx_local._4_4_ = local_24;
  }
  else {
    pbVar1 = stm->rp;
    stm->rp = pbVar1 + 1;
    ctx_local._4_4_ = (uint)*pbVar1;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int hd_read_byte(hd_context *ctx, hd_stream *stm)
{
    int c = EOF;

    if (stm->rp != stm->wp)
        return *stm->rp++;
    hd_try(ctx)
    {
        c = stm->next(ctx, stm, 1);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "read error; treating as end of file");
        stm->error = 1;
        c = EOF;
    }
    if (c == EOF)
        stm->eof = 1;
    return c;
}